

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-solver.cc
# Opt level: O1

void __thiscall
mp::NLFeeder_Easy::
FeedSuffixes<mp::NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,mp::NLFeeder_Easy>>::SuffixWriterFactory>
          (NLFeeder_Easy *this,SuffixWriterFactory *swf)

{
  _Rb_tree_color _Var1;
  NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,_mp::NLFeeder_Easy>_> *pNVar2;
  _Base_ptr p_Var3;
  _Rb_tree_node_base *p_Var4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  double dVar8;
  _Rb_tree<mp::NLSuffix,_mp::NLSuffix,_std::_Identity<mp::NLSuffix>,_std::less<mp::NLSuffix>,_std::allocator<mp::NLSuffix>_>
  local_60;
  
  std::
  _Rb_tree<mp::NLSuffix,_mp::NLSuffix,_std::_Identity<mp::NLSuffix>,_std::less<mp::NLSuffix>,_std::allocator<mp::NLSuffix>_>
  ::_Rb_tree(&local_60,
             (_Rb_tree<mp::NLSuffix,_mp::NLSuffix,_std::_Identity<mp::NLSuffix>,_std::less<mp::NLSuffix>,_std::allocator<mp::NLSuffix>_>
              *)&(this->nlme_).suffixes_);
  p_Var4 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((_Rb_tree_header *)local_60._M_impl.super__Rb_tree_header._M_header._M_left !=
      &local_60._M_impl.super__Rb_tree_header) {
    do {
      p_Var3 = p_Var4[3]._M_parent;
      uVar6 = 0;
      if (p_Var3 != p_Var4[3]._M_left) {
        uVar6 = 0;
        do {
          uVar6 = (ulong)((int)uVar6 + (uint)(*(double *)p_Var3 != 0.0));
          p_Var3 = (_Base_ptr)&p_Var3->_M_parent;
        } while (p_Var3 != p_Var4[3]._M_left);
      }
      _Var1 = p_Var4[3]._M_color;
      if ((_Var1 & 4) == _S_red) {
        if ((int)uVar6 != 0) {
          BinaryFormatter::apr
                    (&swf->nlw_->super_FormatterType,&swf->nlw_->nm,"S%d %d %s\n",(ulong)_Var1,uVar6
                     ,*(undefined8 *)(p_Var4 + 1));
        }
        p_Var3 = p_Var4[3]._M_parent;
        if (p_Var4[3]._M_left != p_Var3) {
          pNVar2 = swf->nlw_;
          lVar7 = 0;
          uVar6 = 0;
          do {
            dVar8 = *(double *)(&p_Var3->_M_color + uVar6 * 2);
            if ((dVar8 != 0.0) || (NAN(dVar8))) {
              if ((_Var1 & 3) == _S_red) {
                uVar5 = (ulong)*(uint *)((long)&((this->var_perm_).
                                                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)->first +
                                        (lVar7 >> 0x1d));
              }
              else {
                uVar5 = uVar6 & 0xffffffff;
              }
              dVar8 = round(dVar8);
              BinaryFormatter::apr
                        (&pNVar2->super_FormatterType,&pNVar2->nm,"%d %d\n",uVar5,
                         (ulong)(uint)(int)dVar8);
            }
            uVar6 = uVar6 + 1;
            p_Var3 = p_Var4[3]._M_parent;
            lVar7 = lVar7 + 0x100000000;
          } while (uVar6 < (ulong)((long)p_Var4[3]._M_left - (long)p_Var3 >> 3));
        }
      }
      else {
        if ((int)uVar6 != 0) {
          BinaryFormatter::apr
                    (&swf->nlw_->super_FormatterType,&swf->nlw_->nm,"S%d %d %s\n",(ulong)_Var1,uVar6
                     ,*(undefined8 *)(p_Var4 + 1));
        }
        p_Var3 = p_Var4[3]._M_parent;
        if (p_Var4[3]._M_left != p_Var3) {
          pNVar2 = swf->nlw_;
          lVar7 = 0;
          uVar6 = 0;
          do {
            if ((*(double *)(&p_Var3->_M_color + uVar6 * 2) != 0.0) ||
               (NAN(*(double *)(&p_Var3->_M_color + uVar6 * 2)))) {
              if ((_Var1 & 3) == _S_red) {
                uVar5 = (ulong)*(uint *)((long)&((this->var_perm_).
                                                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)->first +
                                        (lVar7 >> 0x1d));
              }
              else {
                uVar5 = uVar6 & 0xffffffff;
              }
              BinaryFormatter::apr(&pNVar2->super_FormatterType,&pNVar2->nm,"%d %g\n",uVar5);
            }
            uVar6 = uVar6 + 1;
            p_Var3 = p_Var4[3]._M_parent;
            lVar7 = lVar7 + 0x100000000;
          } while (uVar6 < (ulong)((long)p_Var4[3]._M_left - (long)p_Var3 >> 3));
        }
      }
      p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4);
    } while ((_Rb_tree_header *)p_Var4 != &local_60._M_impl.super__Rb_tree_header);
  }
  std::
  _Rb_tree<mp::NLSuffix,_mp::NLSuffix,_std::_Identity<mp::NLSuffix>,_std::less<mp::NLSuffix>,_std::allocator<mp::NLSuffix>_>
  ::~_Rb_tree(&local_60);
  return;
}

Assistant:

void FeedSuffixes(SuffixWriterFactory& swf) {
    for (const auto& suf: NLME().Suffixes()) {
      int nnz=0;
      for (auto v: suf.values_)
        if (v)
          ++nnz;
      bool ifVars = (0==(suf.kind_&3));
      if (suf.kind_ & 4) {
        auto sw = swf.StartDblSuffix(
              suf.name_.c_str(), suf.kind_, nnz);
        for (size_t i=0; i<suf.values_.size(); ++i)
          if (suf.values_[i])
            sw.Write(ifVars ? VPerm(i) : i,
                     suf.values_[i]);
      } else {
        auto sw = swf.StartIntSuffix(
              suf.name_.c_str(), suf.kind_, nnz);
        for (size_t i=0; i<suf.values_.size(); ++i)
          if (suf.values_[i])
            sw.Write(ifVars ? VPerm(i) : i,
                     std::round(suf.values_[i]));
      }
    }
  }